

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties.cc
# Opt level: O2

shared_ptr<gutil::PropertyNode> * __thiscall
gutil::PropertyNode::getChild(PropertyNode *this,string *_name)

{
  pointer psVar1;
  __type_conflict _Var2;
  size_t i;
  ulong uVar3;
  long lVar4;
  shared_ptr<gutil::PropertyNode> sStack_38;
  
  lVar4 = 0;
  uVar3 = 0;
  while( true ) {
    psVar1 = (this->list).
             super__Vector_base<std::shared_ptr<gutil::PropertyNode>,_std::allocator<std::shared_ptr<gutil::PropertyNode>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->list).
                      super__Vector_base<std::shared_ptr<gutil::PropertyNode>,_std::allocator<std::shared_ptr<gutil::PropertyNode>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4) <= uVar3) {
      std::make_shared<gutil::PropertyNode,std::__cxx11::string_const&>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sStack_38);
      std::
      vector<std::shared_ptr<gutil::PropertyNode>,std::allocator<std::shared_ptr<gutil::PropertyNode>>>
      ::emplace_back<std::shared_ptr<gutil::PropertyNode>>
                ((vector<std::shared_ptr<gutil::PropertyNode>,std::allocator<std::shared_ptr<gutil::PropertyNode>>>
                  *)&this->list,&sStack_38);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&sStack_38.super___shared_ptr<gutil::PropertyNode,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      return (this->list).
             super__Vector_base<std::shared_ptr<gutil::PropertyNode>,_std::allocator<std::shared_ptr<gutil::PropertyNode>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1;
    }
    _Var2 = std::operator==(_name,*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    **)((long)&(psVar1->
                                               super___shared_ptr<gutil::PropertyNode,_(__gnu_cxx::_Lock_policy)2>
                                               )._M_ptr + lVar4));
    if (_Var2) break;
    uVar3 = uVar3 + 1;
    lVar4 = lVar4 + 0x10;
  }
  return (shared_ptr<gutil::PropertyNode> *)
         ((long)&(((this->list).
                   super__Vector_base<std::shared_ptr<gutil::PropertyNode>,_std::allocator<std::shared_ptr<gutil::PropertyNode>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                 super___shared_ptr<gutil::PropertyNode,_(__gnu_cxx::_Lock_policy)2>)._M_ptr + lVar4
         );
}

Assistant:

std::shared_ptr<PropertyNode> &getChild(const std::string &_name)
    {
      for (size_t i=0; i<list.size(); i++)
      {
        if (_name == list[i]->getName())
        {
          return list[i];
        }
      }

      list.push_back(std::make_shared<PropertyNode>(_name));

      return list.back();
    }